

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBitPatterns.cpp
# Opt level: O2

bool anon_unknown.dwarf_566e::equalBitPatterns(char *b1,char *b2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    cVar1 = b1[lVar3];
    cVar2 = b2[lVar3];
    if ((cVar1 == '\0') || (cVar2 == '\0')) {
      return cVar1 == '\0' && cVar2 == '\0';
    }
    if (((cVar2 != 'X') && (cVar1 != 'X')) && (cVar1 != cVar2)) break;
    lVar3 = lVar3 + 1;
  }
  return false;
}

Assistant:

bool
equalBitPatterns (const char *b1, const char *b2)
{
    //
    // Returns true if the characters in zero-terminated string b1
    // are the same as the charaters in string b2, except for places
    // where b1 or b2 contains an 'X'.  For example:
    //
    //	equalBitPatterns ("100", "100") returns true
    //	equalBitPatterns ("100", "101") returns false
    //	equalBitPatterns ("10X", "101") returns true
    //	equalBitPatterns ("10X", "100") returns true
    //

    while (*b1 && *b2)
    {
	if (*b1 != *b2 && *b1 != 'X' && *b2 != 'X')
	    return false;

	++b1;
	++b2;
    }

    return !(*b1 || *b2);
}